

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_dce.cpp
# Opt level: O0

uint32_t __thiscall
spvtools::opt::VectorDCE::GetVectorComponentCount(VectorDCE *this,uint32_t type_id)

{
  int iVar1;
  uint32_t uVar2;
  IRContext *this_00;
  TypeManager *this_01;
  Type *pTVar3;
  undefined4 extraout_var;
  Vector *vector_type;
  Type *type;
  TypeManager *type_mgr;
  uint32_t type_id_local;
  VectorDCE *this_local;
  
  if (type_id == 0) {
    __assert_fail("type_id != 0 && \"Trying to get the vector element count, but the type id is 0\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/vector_dce.cpp"
                  ,0x12e,"uint32_t spvtools::opt::VectorDCE::GetVectorComponentCount(uint32_t)");
  }
  this_00 = Pass::context((Pass *)this);
  this_01 = IRContext::get_type_mgr(this_00);
  pTVar3 = analysis::TypeManager::GetType(this_01,type_id);
  iVar1 = (*pTVar3->_vptr_Type[0xe])();
  if ((Vector *)CONCAT44(extraout_var,iVar1) == (Vector *)0x0) {
    __assert_fail("vector_type && \"Trying to get the vector element count, but the type is not a vector\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/vector_dce.cpp"
                  ,0x134,"uint32_t spvtools::opt::VectorDCE::GetVectorComponentCount(uint32_t)");
  }
  uVar2 = analysis::Vector::element_count((Vector *)CONCAT44(extraout_var,iVar1));
  return uVar2;
}

Assistant:

uint32_t VectorDCE::GetVectorComponentCount(uint32_t type_id) {
  assert(type_id != 0 &&
         "Trying to get the vector element count, but the type id is 0");
  analysis::TypeManager* type_mgr = context()->get_type_mgr();
  const analysis::Type* type = type_mgr->GetType(type_id);
  const analysis::Vector* vector_type = type->AsVector();
  assert(
      vector_type &&
      "Trying to get the vector element count, but the type is not a vector");
  return vector_type->element_count();
}